

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::microfacet::ndf(microfacet *this,vec3 *wm,args *args)

{
  float extraout_XMM0_Da;
  float __x;
  vec3 vVar1;
  
  vVar1 = djb::operator*(&args->mtra,wm);
  __x = vVar1.z * vVar1.z + vVar1.x * vVar1.x + vVar1.y * vVar1.y;
  if (__x <= 0.0) {
    __assert_fail("x > T(0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/plot-brdf/dj_brdf.h"
                  ,0x259,"T djb::inversesqrt(const T &) [T = float]");
  }
  if (__x < 0.0) {
    sqrtf(__x);
  }
  (*(this->super_brdf)._vptr_brdf[0xb])(this);
  return extraout_XMM0_Da * (args->detm / (__x * __x));
}

Assistant:

float_t microfacet::ndf(const vec3 &wm, const args &args) const
{
	vec3 wm_std = args.mtra * wm;
	float_t nrmsqr = dot(wm_std, wm_std);
	return ndf_std(wm_std * inversesqrt(nrmsqr)) * (args.detm / sqr(nrmsqr));
}